

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

xmlParserInputPtr
xmlCtxtNewInputFromUrl
          (xmlParserCtxtPtr ctxt,char *url,char *publicId,char *encoding,xmlParserInputFlags flags)

{
  xmlParserInputPtr input;
  
  if ((url != (char *)0x0 && ctxt != (xmlParserCtxtPtr)0x0) &&
     (input = xmlLoadResource(ctxt,url,publicId,XML_RESOURCE_MAIN_DOCUMENT),
     input != (xmlParserInputPtr)0x0)) {
    if (encoding == (char *)0x0) {
      return input;
    }
    xmlSwitchInputEncodingName(ctxt,input,encoding);
    return input;
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

xmlParserInputPtr
xmlCtxtNewInputFromUrl(xmlParserCtxtPtr ctxt, const char *url,
                       const char *publicId, const char *encoding,
                       xmlParserInputFlags flags ATTRIBUTE_UNUSED) {
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (url == NULL))
	return(NULL);

    input = xmlLoadResource(ctxt, url, publicId, XML_RESOURCE_MAIN_DOCUMENT);
    if (input == NULL)
        return(NULL);

    if (encoding != NULL)
        xmlSwitchInputEncodingName(ctxt, input, encoding);

    return(input);
}